

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O3

int ndn_name_tlv_decode(ndn_decoder_t *decoder,ndn_name_t *name)

{
  byte bVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ndn_name_t *component;
  
  puVar2 = decoder->input_value;
  uVar6 = decoder->offset;
  bVar1 = puVar2[uVar6];
  uVar5 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar4 = 1;
  }
  else {
    uVar3 = decoder->input_size - uVar6;
    if (uVar3 < 3 || bVar1 != 0xfd) {
      if (uVar3 < 5 || uVar5 != 0xfe) {
        return -0xe;
      }
      uVar5 = (uint)puVar2[uVar6 + 4] |
              (uint)puVar2[uVar6 + 3] << 8 |
              (uint)puVar2[uVar6 + 2] << 0x10 | (uint)puVar2[uVar6 + 1] << 0x18;
      iVar4 = 5;
    }
    else {
      uVar5 = (uint)CONCAT11(puVar2[uVar6 + 1],puVar2[uVar6 + 2]);
      iVar4 = 3;
    }
  }
  uVar6 = iVar4 + uVar6;
  decoder->offset = uVar6;
  iVar4 = -0xc;
  if (uVar5 == 7) {
    bVar1 = puVar2[uVar6];
    uVar5 = (uint)bVar1;
    if (bVar1 < 0xfd) {
      iVar7 = 1;
    }
    else {
      uVar5 = decoder->input_size - uVar6;
      if (uVar5 < 3 || bVar1 != 0xfd) {
        if (uVar5 < 5 || bVar1 != 0xfe) {
          return -0xe;
        }
        uVar5 = (uint)puVar2[uVar6 + 4] |
                (uint)puVar2[uVar6 + 3] << 8 |
                (uint)puVar2[uVar6 + 2] << 0x10 | (uint)puVar2[uVar6 + 1] << 0x18;
        iVar7 = 5;
      }
      else {
        uVar5 = (uint)CONCAT11(puVar2[uVar6 + 1],puVar2[uVar6 + 2]);
        iVar7 = 3;
      }
    }
    decoder->offset = iVar7 + uVar6;
    lVar8 = 0;
    component = name;
    do {
      if (iVar7 + uVar6 + uVar5 <= decoder->offset) {
        name->components_size = (uint8_t)lVar8;
        return 0;
      }
      if (lVar8 == 10) {
        return -10;
      }
      iVar4 = name_component_tlv_decode(decoder,component->components);
      lVar8 = lVar8 + 1;
      component = (ndn_name_t *)(component->components + 1);
    } while (-1 < iVar4);
  }
  return iVar4;
}

Assistant:

int
ndn_name_tlv_decode(ndn_decoder_t* decoder, ndn_name_t* name)
{
  int ret_val = -1;
  uint32_t type = 0;
  ret_val = decoder_get_type(decoder, &type);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (type != TLV_Name) {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t length = 0;
  ret_val = decoder_get_length(decoder, &length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t start_offset = decoder->offset;
  int counter = 0;
  while (decoder->offset < start_offset + length) {
    if (counter >= NDN_NAME_COMPONENTS_SIZE)
      return NDN_OVERSIZE;
    int result = name_component_tlv_decode(decoder, &name->components[counter]);
    if (result < 0)
      return result;
    ++counter;
  }
  name->components_size = counter;
  return 0;
}